

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

int kj::_::Debug::syscallError<kj::(anonymous_namespace)::TestCase82::run()::__0>
              (anon_class_8_1_a8c68091 *call,bool nonblocking)

{
  int iVar1;
  int errorNum;
  bool nonblocking_local;
  anon_class_8_1_a8c68091 *call_local;
  
  do {
    iVar1 = kj::anon_unknown_0::TestCase82::run::anon_class_8_1_a8c68091::operator()(call);
    if (-1 < iVar1) {
      return 0;
    }
    iVar1 = getOsErrorNumber(nonblocking);
  } while (iVar1 == -1);
  return iVar1;
}

Assistant:

int Debug::syscallError(Call&& call, bool nonblocking) {
  while (call() < 0) {
    int errorNum = getOsErrorNumber(nonblocking);
    // getOsErrorNumber() returns -1 to indicate EINTR.
    // Also, if nonblocking is true, then it returns 0 on EAGAIN, which will then be treated as a
    // non-error.
    if (errorNum != -1) {
      return errorNum;
    }
  }
  return 0;
}